

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O0

Dim * __thiscall
cnn::KMaxPooling::dim_forward(KMaxPooling *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  initializer_list<unsigned_int> x;
  uint uVar1;
  ostream *poVar2;
  void *this_00;
  invalid_argument *piVar3;
  const_reference pvVar4;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  Dim *in_RSI;
  Dim *in_RDI;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_stack_ffffffffffffffa8;
  Dim *os;
  
  if (in_RSI[2].d[2] == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Bad bad k in KMaxPooling: ");
    this_00 = (void *)std::ostream::operator<<(poVar2,in_RSI[2].d[2]);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"bad k in KMaxPooling");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  os = in_RDI;
  pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
  uVar1 = Dim::ndims(pvVar4);
  if (uVar1 == 2) {
    pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
    uVar1 = Dim::cols(pvVar4);
    if (in_RSI[2].d[2] <= uVar1) {
      pvVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
      uVar1 = Dim::rows(pvVar4);
      x._M_array._4_4_ = in_RSI[2].d[2];
      x._M_array._0_4_ = uVar1;
      x._M_len = (size_type)&stack0xffffffffffffffc8;
      Dim::Dim(in_RSI,x);
      return in_RDI;
    }
  }
  std::operator<<((ostream *)&std::cerr,"Bad input dimensions in KMaxPooling: ");
  poVar2 = cnn::operator<<((ostream *)os,in_stack_ffffffffffffffa8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar3,"bad input dimensions in KMaxPooling");
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim KMaxPooling::dim_forward(const vector<Dim>& xs) const {
  if (k < 1) {
    cerr << "Bad bad k in KMaxPooling: " << k << endl;
    throw std::invalid_argument("bad k in KMaxPooling");
  }
  if (xs[0].ndims() != 2 || (xs[0].cols() < k)) {
    cerr << "Bad input dimensions in KMaxPooling: " << xs << endl;
    throw std::invalid_argument("bad input dimensions in KMaxPooling");
  }
  return Dim({xs[0].rows(), k});
}